

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O1

void __thiscall Polymer::Initialize(Polymer *this)

{
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *pIVar1;
  element_type *peVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pIVar4;
  Interval<std::shared_ptr<ReleaseSite>,_unsigned_long> *interval;
  SpeciesTracker *pSVar5;
  pointer pIVar6;
  int iVar7;
  pointer pIVar8;
  pointer pIVar9;
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  results;
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  term_results;
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> local_b8;
  unsigned_long local_88;
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *local_80;
  unsigned_long local_78;
  IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *local_70;
  intervalVector local_68;
  __shared_ptr<Polymer,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  __shared_ptr<Polymer,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::IntervalTree
            (&local_b8,&this->binding_intervals_,0x10,0x40,0,0,0x200);
  pIVar1 = &this->binding_sites_;
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::operator=(pIVar1,&local_b8);
  std::
  unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::~unique_ptr(&local_b8.right);
  std::
  unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::~unique_ptr(&local_b8.left);
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::~vector(&local_b8.intervals);
  IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>::IntervalTree
            ((IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)&local_b8,
             &this->release_intervals_,0x10,0x40,0,0,0x200);
  local_70 = &this->release_sites_;
  IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>::operator=
            (local_70,(intervalTree *)&local_b8);
  std::
  unique_ptr<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ::~unique_ptr((unique_ptr<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                 *)&local_b8.right);
  std::
  unique_ptr<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ::~unique_ptr((unique_ptr<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                 *)&local_b8.left);
  std::
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ::~vector((vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
             *)&local_b8);
  local_b8.intervals.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.intervals.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.intervals.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88 = (unsigned_long)(this->mask_).super_MobileElement.start_;
  local_78 = (unsigned_long)(this->mask_).super_MobileElement.stop_;
  local_80 = pIVar1;
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::findOverlapping
            (pIVar1,local_88,local_78,&local_b8.intervals);
  pIVar4 = local_b8.intervals.
           super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_b8.intervals.
      super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_b8.intervals.
      super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pIVar8 = local_b8.intervals.
             super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pSVar5 = SpeciesTracker::Instance();
      peVar2 = (pIVar8->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_ptr<Polymer,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Polymer,void>
                (local_40,(__weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2> *)
                          &this->super_enable_shared_from_this<Polymer>);
      SpeciesTracker::Add(pSVar5,&(peVar2->super_FixedElement).name_,(Ptr *)local_40);
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
      peVar2 = (pIVar8->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar7 = (peVar2->super_FixedElement).covered_ + 1;
      (peVar2->super_FixedElement).covered_ = iVar7;
      (peVar2->super_FixedElement).old_covered_ = iVar7;
      pIVar8 = pIVar8 + 1;
    } while (pIVar8 != pIVar4);
  }
  local_68.
  super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>::findOverlapping
            (local_70,local_88,local_78,&local_68);
  pIVar1 = local_80;
  pIVar8 = local_b8.intervals.
           super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pIVar4 = local_b8.intervals.
           super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (pIVar6 = local_68.
                super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pIVar6 != local_68.
                super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pIVar6 = pIVar6 + 1) {
    peVar3 = (pIVar6->value).super___shared_ptr<ReleaseSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar7 = (peVar3->super_FixedElement).covered_ + 1;
    (peVar3->super_FixedElement).covered_ = iVar7;
    (peVar3->super_FixedElement).old_covered_ = iVar7;
  }
  pIVar9 = local_b8.intervals.
           super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_b8.intervals.
      super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_b8.intervals.
      super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      this_00 = (pIVar9->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      pIVar9 = pIVar9 + 1;
    } while (pIVar9 != pIVar8);
    local_b8.intervals.
    super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar4;
  }
  this->total_elements_ = 0;
  this->degraded_elements_ = 0;
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::findContained
            (pIVar1,(long)this->start_,local_88,&local_b8.intervals);
  pIVar4 = local_b8.intervals.
           super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_b8.intervals.
      super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_b8.intervals.
      super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pIVar8 = local_b8.intervals.
             super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pSVar5 = SpeciesTracker::Instance();
      peVar2 = (pIVar8->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_ptr<Polymer,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Polymer,void>
                (local_50,(__weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2> *)
                          &this->super_enable_shared_from_this<Polymer>);
      SpeciesTracker::Add(pSVar5,&(peVar2->super_FixedElement).name_,(Ptr *)local_50);
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      }
      peVar2 = (pIVar8->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar7 = (peVar2->super_FixedElement).covered_;
      if (0 < iVar7) {
        (peVar2->super_FixedElement).covered_ = iVar7 + -1;
      }
      (peVar2->super_FixedElement).old_covered_ = (peVar2->super_FixedElement).covered_;
      LogUncover(this,&(peVar2->super_FixedElement).name_);
      this->total_elements_ = this->total_elements_ + 1;
      pIVar8 = pIVar8 + 1;
    } while (pIVar8 != pIVar4);
  }
  std::
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ::~vector(&local_68);
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::~vector(&local_b8.intervals);
  return;
}

Assistant:

void Polymer::Initialize() {
  // Construct invterval trees
  binding_sites_ = IntervalTree<BindingSite::Ptr>(binding_intervals_);
  release_sites_ = IntervalTree<ReleaseSite::Ptr>(release_intervals_);
  std::vector<Interval<BindingSite::Ptr>> results;

  // Cover all masked sites
  int mask_start = mask_.start();
  int mask_stop = mask_.stop();
  binding_sites_.findOverlapping(mask_start, mask_stop, results);

  for (auto &interval : results) {
    // TODO: move to wrapper reaction
    SpeciesTracker::Instance().Add(interval.value->name(), shared_from_this());
    interval.value->Cover();
    interval.value->ResetState();
    // We don't need to log anything here because covered promoters are
    // invisible to SpeciesTracker.
  }

  std::vector<Interval<ReleaseSite::Ptr>> term_results;
  release_sites_.findOverlapping(mask_start, mask_stop, term_results);

  for (auto &interval : term_results) {
    interval.value->Cover();
    interval.value->ResetState();
  }

  // Make sure all unmasked sites are uncovered
  results.clear();
  total_elements_ = 0;
  degraded_elements_ = 0;
  binding_sites_.findContained(start_, mask_start, results);
  for (auto &interval : results) {
    // TODO: Move to bridge reaction
    SpeciesTracker::Instance().Add(interval.value->name(), shared_from_this());
    interval.value->Uncover();
    interval.value->ResetState();
    LogUncover(interval.value->name());
    total_elements_ += 1;
  }

  // for (auto elem : uncovered_) {
  //  std::cout << elem.first + " " + std::to_string(elem.second) << std::endl;
  // }
}